

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  REF_NODE ref_node;
  REF_NODE pRVar7;
  REF_DBL *pRVar8;
  size_t __size;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  REF_STATUS RVar14;
  void *__ptr;
  long *plVar15;
  ulong uVar16;
  long lVar17;
  undefined8 uVar18;
  long lVar19;
  int node;
  ulong uVar20;
  long lVar21;
  char *pcVar22;
  REF_EDGE ref_edge_00;
  double dVar23;
  REF_EDGE ref_edge;
  REF_DBL limit_metric [6];
  REF_DBL limited [6];
  double local_108;
  double local_100;
  REF_EDGE local_d8;
  REF_GRID local_d0;
  long local_c8;
  REF_DBL *local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  long local_a0;
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  dVar23 = log(r);
  uVar13 = ref_edge_create(&local_d8,ref_grid);
  if (uVar13 == 0) {
    pRVar7 = ref_grid->node;
    uVar13 = pRVar7->max;
    if ((int)uVar13 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL negative");
      return 1;
    }
    __size = (ulong)uVar13 * 0x30;
    local_d0 = ref_grid;
    __ptr = malloc(__size);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL NULL");
      return 2;
    }
    if ((ulong)uVar13 != 0) {
      plVar15 = pRVar7->global;
      uVar16 = 0;
      do {
        if (-1 < *plVar15) {
          uVar20 = uVar16 & 0x7fffffff0;
          uVar18 = *(undefined8 *)((long)metric + uVar20);
          uVar9 = ((undefined8 *)((long)metric + uVar20))[1];
          puVar1 = (undefined8 *)((long)metric + uVar20 + 0x10);
          uVar10 = *puVar1;
          uVar11 = puVar1[1];
          puVar1 = (undefined8 *)((long)metric + uVar20 + 0x20);
          uVar12 = puVar1[1];
          puVar2 = (undefined8 *)((long)__ptr + uVar20 + 0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar12;
          puVar1 = (undefined8 *)((long)__ptr + uVar20 + 0x10);
          *puVar1 = uVar10;
          puVar1[1] = uVar11;
          *(undefined8 *)((long)__ptr + uVar20) = uVar18;
          ((undefined8 *)((long)__ptr + uVar20))[1] = uVar9;
        }
        uVar16 = uVar16 + 0x30;
        plVar15 = plVar15 + 1;
      } while (__size != uVar16);
    }
    ref_edge_00 = local_d8;
    if (0 < local_d8->n) {
      lVar17 = 0;
      do {
        iVar6 = local_d8->e2n[lVar17 * 2];
        lVar19 = (long)iVar6;
        node = local_d8->e2n[lVar17 * 2 + 1];
        lVar21 = (long)node;
        pRVar8 = ref_node->real;
        local_b8 = pRVar8[lVar21 * 0xf] - pRVar8[lVar19 * 0xf];
        local_b0 = pRVar8[lVar21 * 0xf + 1] - pRVar8[lVar19 * 0xf + 1];
        local_a8 = pRVar8[lVar21 * 0xf + 2] - pRVar8[lVar19 * 0xf + 2];
        dVar3 = *(double *)((long)__ptr + lVar21 * 0x30 + 8);
        dVar4 = *(double *)((long)__ptr + lVar21 * 0x30 + 0x10);
        dVar5 = *(double *)((long)__ptr + lVar21 * 0x30 + 0x20);
        local_100 = (*(double *)((long)__ptr + lVar21 * 0x30 + 0x28) * local_a8 +
                    dVar4 * local_b8 + dVar5 * local_b0) * local_a8 +
                    (dVar4 * local_a8 +
                    *(double *)((long)__ptr + lVar21 * 0x30) * local_b8 + local_b0 * dVar3) *
                    local_b8 +
                    (dVar5 * local_a8 +
                    dVar3 * local_b8 + *(double *)((long)__ptr + lVar21 * 0x30 + 0x18) * local_b0) *
                    local_b0;
        local_a0 = lVar17;
        if (local_100 < 0.0) {
          local_100 = sqrt(local_100);
        }
        else {
          local_100 = SQRT(local_100);
        }
        local_c0 = (REF_DBL *)((long)__ptr + lVar21 * 0x30);
        local_108 = pow(local_100 * dVar23 + 1.0,-2.0);
        lVar17 = 0;
        do {
          local_98[lVar17] =
               *(double *)((long)__ptr + lVar17 * 8 + (long)(node * 6) * 8) * local_108;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 6);
        pRVar8 = (REF_DBL *)((long)__ptr + lVar19 * 0x30);
        RVar14 = ref_matrix_intersect(pRVar8,local_98,local_68);
        if (RVar14 == 0) {
          local_c8 = lVar19;
          RVar14 = ref_matrix_intersect(metric + lVar19 * 6,local_68,metric + lVar19 * 6);
          if (RVar14 != 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x307,"ref_metric_metric_space_gradation","update m0");
            node = (int)local_c8;
            goto LAB_001be20a;
          }
          local_100 = (pRVar8[5] * local_a8 + pRVar8[2] * local_b8 + local_b0 * pRVar8[4]) *
                      local_a8 +
                      (pRVar8[2] * local_a8 + *pRVar8 * local_b8 + local_b0 * pRVar8[1]) * local_b8
                      + (pRVar8[4] * local_a8 + pRVar8[1] * local_b8 + pRVar8[3] * local_b0) *
                        local_b0;
          if (local_100 < 0.0) {
            local_100 = sqrt(local_100);
          }
          else {
            local_100 = SQRT(local_100);
          }
          local_108 = pow(local_100 * dVar23 + 1.0,-2.0);
          lVar17 = 0;
          do {
            local_98[lVar17] =
                 *(double *)((long)__ptr + lVar17 * 8 + (long)(iVar6 * 6) * 8) * local_108;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 6);
          RVar14 = ref_matrix_intersect(local_c0,local_98,local_68);
          if (RVar14 != 0) {
            uVar18 = 0x313;
            pcVar22 = "limit m1 with enlarged m0";
LAB_001be1fb:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar18,"ref_metric_metric_space_gradation",pcVar22);
            goto LAB_001be20a;
          }
          RVar14 = ref_matrix_intersect(metric + lVar21 * 6,local_68,metric + lVar21 * 6);
          if (RVar14 != 0) {
            uVar18 = 0x31b;
            pcVar22 = "update m1";
            goto LAB_001be1fb;
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x2ff,"ref_metric_metric_space_gradation","limit m0 with enlarged m1");
          node = iVar6;
LAB_001be20a:
          ref_node_location(ref_node,node);
          printf("ratio %24.15e enlarge %24.15e \n",local_100,local_108);
          puts("RECOVER ref_metric_metric_space_gradation");
        }
        lVar17 = local_a0 + 1;
        ref_edge_00 = local_d8;
      } while (lVar17 < local_d8->n);
    }
    free(__ptr);
    ref_edge_free(ref_edge_00);
    uVar13 = ref_node_ghost_dbl(local_d0->node,metric,6);
    if (uVar13 == 0) {
      return 0;
    }
    pcVar22 = "update ghosts";
    uVar18 = 0x327;
  }
  else {
    pcVar22 = "orig edges";
    uVar18 = 0x2e5;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar18,
         "ref_metric_metric_space_gradation",(ulong)uVar13,pcVar22);
  return uVar13;
}

Assistant:

REF_FCN REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,
                                                     REF_GRID ref_grid,
                                                     REF_DBL r) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028 equation (9) */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node1] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m0 with enlarged m1");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node0]), limited,
                                            &(metric[6 * node0]))) {
      REF_WHERE("update m0");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node0] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m1 with enlarged m0");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node1]), limited,
                                            &(metric[6 * node1]))) {
      REF_WHERE("update m1");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}